

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

bool __thiscall cmCTestGlobalVC::WriteXMLUpdates(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *this_00;
  char *pcVar5;
  reference path;
  bool local_3b9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>
  *d;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  *__range1;
  ostringstream local_340 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  bool result;
  cmXMLWriter *xml_local;
  cmCTestGlobalVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  this_00 = std::operator<<((ostream *)local_198,
                            "   Gathering version information (one . per revision):\n    ");
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6a,pcVar5,false);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  uVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xb])();
  std::__cxx11::ostringstream::ostringstream(local_340);
  std::ostream::operator<<(local_340,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6c,pcVar5,false);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_340);
  uVar4 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[10])();
  local_3b9 = (uVar4 & 1) != 0 && (uVar3 & 1) != 0;
  (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xc])(this,xml);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
           ::begin(&this->Dirs);
  d = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
         ::end(&this->Dirs);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&d), bVar2) {
    path = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
           ::operator*(&__end1);
    WriteXMLDirectory(this,xml,&path->first,&path->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
    ::operator++(&__end1);
  }
  return local_3b9;
}

Assistant:

bool cmCTestGlobalVC::WriteXMLUpdates(cmXMLWriter& xml)
{
  bool result = true;
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);
  result = this->LoadRevisions() && result;
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  result = this->LoadModifications() && result;

  this->WriteXMLGlobal(xml);

  for (auto const& d : this->Dirs) {
    this->WriteXMLDirectory(xml, d.first, d.second);
  }

  return result;
}